

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SrcListShiftJoinType(Parse *pParse,SrcList *p)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  u8 *puVar6;
  byte bVar7;
  ulong uVar8;
  byte *pbVar9;
  
  if ((pParse != (Parse *)0x0) && (lVar4 = (long)*(int *)&pParse->db, 1 < lVar4)) {
    uVar8 = lVar4 + 1;
    pbVar9 = (byte *)((long)pParse + lVar4 * 0x48 + -0x28);
    bVar7 = 0;
    do {
      pbVar1 = pbVar9 + -0x48;
      *pbVar9 = *pbVar1;
      pbVar9 = pbVar9 + -0x48;
      bVar7 = bVar7 | *pbVar1;
      uVar8 = uVar8 - 1;
    } while (2 < uVar8);
    pParse->isMultiWrite = '\0';
    if ((bVar7 & 0x10) != 0) {
      pbVar9 = (byte *)((long)pParse + lVar4 * 0x48 + -0x28);
      do {
        lVar5 = lVar4;
        if (lVar5 < 2) break;
        bVar7 = *pbVar9;
        pbVar9 = pbVar9 + -0x48;
        lVar4 = lVar5 + -1;
      } while ((bVar7 & 0x10) == 0);
      iVar3 = 1;
      if (1 < lVar5) {
        iVar3 = (int)lVar5;
      }
      puVar6 = &pParse->isMultiWrite + (long)(iVar3 + -2) * 0x48;
      lVar4 = (long)(iVar3 + -2) + 1;
      do {
        *puVar6 = *puVar6 | 0x40;
        puVar6 = puVar6 + -0x48;
        lVar5 = lVar4 + -1;
        bVar2 = 0 < lVar4;
        lVar4 = lVar5;
      } while (lVar5 != 0 && bVar2);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListShiftJoinType(Parse *pParse, SrcList *p){
  (void)pParse;
  if( p && p->nSrc>1 ){
    int i = p->nSrc-1;
    u8 allFlags = 0;
    do{
      allFlags |= p->a[i].fg.jointype = p->a[i-1].fg.jointype;
    }while( (--i)>0 );
    p->a[0].fg.jointype = 0;

    /* All terms to the left of a RIGHT JOIN should be tagged with the
    ** JT_LTORJ flags */
    if( allFlags & JT_RIGHT ){
      for(i=p->nSrc-1; ALWAYS(i>0) && (p->a[i].fg.jointype&JT_RIGHT)==0; i--){}
      i--;
      assert( i>=0 );
      do{
        p->a[i].fg.jointype |= JT_LTORJ;
      }while( (--i)>=0 );
    }
  }
}